

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_init(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  char *pcVar5;
  uint64_t eval_b;
  uint64_t eval_a;
  uv_timer_t handle;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&handle);
  if (iVar1 == 0) {
    uVar3 = uv_timer_get_repeat(&handle);
    if (uVar3 == 0) {
      uv_timer_get_due_in(&handle);
      iVar1 = uv_is_active((uv_handle_t *)&handle);
      if (iVar1 == 0) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "0 == uv_loop_close(uv_default_loop())";
        uVar4 = 0xa7;
      }
      else {
        pcVar5 = "0 == uv_is_active((uv_handle_t*) &handle)";
        uVar4 = 0xa5;
      }
    }
    else {
      pcVar5 = "0 == uv_timer_get_repeat(&handle)";
      uVar4 = 0xa3;
    }
  }
  else {
    pcVar5 = "0 == uv_timer_init(uv_default_loop(), &handle)";
    uVar4 = 0xa2;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c",
          uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(timer_init) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  ASSERT(0 == uv_timer_get_repeat(&handle));
  ASSERT_UINT64_LE(0, uv_timer_get_due_in(&handle));
  ASSERT(0 == uv_is_active((uv_handle_t*) &handle));

  MAKE_VALGRIND_HAPPY();
  return 0;
}